

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O1

wstring * __thiscall
mjs::number_to_radix_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int radix)

{
  wstring *pwVar1;
  undefined1 int_part;
  double x_00;
  wstring local_48;
  double local_28;
  
  if (((int)this == 10) || (0x22 < (int)this - 2U)) {
    __assert_fail("radix >= 2 && radix != 10 && radix <= 36",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0xf9,"std::wstring mjs::number_to_radix_string(double, int)");
  }
  int_part = false;
  if ((ulong)ABS(x) < 0x7ff0000000000000) {
    if ((x != 0.0) || (NAN(x))) {
      if (0.0 <= x) {
        local_28 = x;
        x_00 = floor(x);
        local_28 = local_28 - x_00;
        if ((x_00 != 0.0) || (NAN(x_00))) {
          (anonymous_namespace)::to_radix_string_inner_abi_cxx11_
                    (__return_storage_ptr__,(_anonymous_namespace_ *)((ulong)this & 0xffffffff),x_00
                     ,1,(bool)int_part);
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)__return_storage_ptr__,L"0",L"");
        }
        if ((local_28 == 0.0) && (!NAN(local_28))) {
          return __return_storage_ptr__;
        }
        std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
        (anonymous_namespace)::to_radix_string_inner_abi_cxx11_
                  (&local_48,(_anonymous_namespace_ *)((ulong)this & 0xffffffff),local_28,0,
                   (bool)int_part);
        std::__cxx11::wstring::_M_append
                  ((wchar_t *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
      }
      else {
        number_to_radix_string_abi_cxx11_(&local_48,(mjs *)((ulong)this & 0xffffffff),-x,radix);
        pwVar1 = (wstring *)
                 std::__cxx11::wstring::replace((ulong)&local_48,0,(wchar_t *)0x0,0x1a8fe8);
        std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,pwVar1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)__return_storage_ptr__,L"0",L"");
    }
  }
  else {
    number_to_string_abi_cxx11_(__return_storage_ptr__,this,x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring number_to_radix_string(double x, int radix) {
    assert(radix >= 2 && radix != 10 && radix <= 36);
    if (!std::isfinite(x)) {
        return number_to_string(x);
    } else if (x == 0.0) {
        return L"0";
    } else if (x < 0) {
        return L"-" + number_to_radix_string(-x, radix);
    }
    assert(std::isfinite(x) && x > 0);

    const double int_part  = std::floor(x);
    const double frac_part = x - int_part;

    auto res = int_part ? to_radix_string_inner(int_part, radix, true) : L"0";
    if (frac_part != 0.0) {
        res += '.';
        res += to_radix_string_inner(frac_part, radix, false);
    }

    return res;

}